

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O3

void __thiscall
directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_3)

{
  compressed_sparse_matrix<entry_t> *this_00;
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  pair<int,_float> *ppVar4;
  ulong uVar5;
  filtered_directed_graph_t *pfVar6;
  uint uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  ulong local_a8;
  long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  directed_flag_complex_coboundary_cell_t local_50;
  
  if ((this->is_first == true) &&
     (uVar2 = this->current_index * 0x3afb7e91 + 0x3b2fec51,
     (uVar2 >> 4 | uVar2 * 0x10000000) < 0x68db9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dimension ",10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->current_dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": computed ca. ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if (this->total_cell_number != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," coboundaries",0xd);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r",1);
  }
  compressed_sparse_matrix<entry_t>::append_column(this->coboundary_matrix);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  uVar5 = (ulong)(uint)size;
  if (0 < size) {
    uVar9 = 0;
    do {
      local_50.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
           (_func_int **)(ulong)(first_vertex[uVar9] >> 6);
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_50);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)
             local_50.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  if (-1 < size) {
    local_68 = (ulong)(size + 1);
    pfVar6 = this->graph;
    local_a8 = 0;
    local_60 = uVar5;
    do {
      uVar9 = (pfVar6->super_directed_graph_t).incidence_row_length;
      if (uVar9 != 0) {
        local_70 = local_a8 & 0xffff;
        uVar10 = 0;
        do {
          local_58 = uVar10;
          if (size == 0) {
            uVar13 = 0xffffffffffffffff;
          }
          else {
            uVar13 = 0xffffffffffffffff;
            uVar11 = 0;
            do {
              bVar1 = (byte)first_vertex[uVar11] & 0x3f;
              uVar12 = -2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1;
              if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar11] != uVar10) {
                uVar12 = 0xffffffffffffffff;
              }
              pvVar8 = &(pfVar6->super_directed_graph_t).incidence_incoming;
              if (uVar11 < local_a8) {
                pvVar8 = &(pfVar6->super_directed_graph_t).incidence_outgoing;
              }
              uVar13 = uVar13 & uVar12 &
                       (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start
                       [first_vertex[uVar11] * uVar9 + uVar10];
            } while ((uVar13 != 0) && (uVar11 = uVar11 + 1, uVar11 < uVar5));
          }
          while (local_90 = uVar10 << 6, uVar13 != 0) {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            local_90._0_4_ = (uint)uVar5 | (uint)local_90;
            uVar2 = (uint)local_90;
            if ((short)local_a8 != 0) {
              uVar2 = (uint)*first_vertex;
            }
            uVar7 = (uint)local_90;
            if (local_70 != 0) {
              uVar7 = (uint)*first_vertex;
            }
            uVar9 = this->nb_threads;
            this_00 = this->coboundary_matrix;
            local_50.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
                 (_func_int **)&PTR_vertex_00151248;
            local_50._insert_position = local_70;
            local_50._insert_vertex = (vertex_index_t)(uint)local_90;
            local_50.super_directed_flag_complex_cell_t.vertices = first_vertex;
            ppVar4 = directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
                     get_data<directed_flag_complex_coboundary_cell_t>
                               ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
                                ((long)&((this->complex->vertex_cells).
                                         super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->vertex +
                                (ulong)((uVar7 & 0xffff) * 0x18)),this->current_dimension + 1,
                                &local_50,0);
            uVar13 = uVar13 & ~(1L << (uVar5 & 0x3f));
            uVar5 = (ulong)(*(int *)&this->modulus - 1U & 0xffff) << 0x20;
            if ((local_a8 & 1) == 0) {
              uVar5 = 0x100000000;
            }
            compressed_sparse_matrix<entry_t>::push_back
                      (this_00,(entry_t)((uint)(ppVar4->first +
                                               (int)(this->cell_index_offsets->
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [(short)((ulong)(uVar2 & 0xffff) % uVar9)]) |
                                        uVar5));
          }
          uVar10 = local_58 + 1;
          pfVar6 = this->graph;
          uVar9 = (pfVar6->super_directed_graph_t).incidence_row_length;
          uVar5 = local_60;
        } while (uVar10 < uVar9);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_68);
  }
  this->current_index = this->current_index + 1;
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					auto cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					short thread_index = cb.vertex(0) % nb_threads;
					coboundary_matrix.push_back(make_entry(complex.get_data(current_dimension + 1, cb).first +
					                                           index_t(cell_index_offsets[thread_index]),
					                                       index_t(i & 1 ? -1 + modulus : 1)));
				}
			}
		}

		current_index++;
	}